

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

char * transform_schema2json(lys_module *module,char *expr)

{
  uint8_t *puVar1;
  size_t sVar2;
  lyxp_expr *expr_00;
  lys_module *plVar3;
  ushort **ppuVar4;
  LY_ERR *pLVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  size_t local_58;
  char *local_40;
  long local_38;
  
  sVar2 = strlen(expr);
  local_58 = sVar2 + 1;
  local_40 = (char *)malloc(local_58);
  if (local_40 == (char *)0x0) {
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_schema2json");
  }
  else {
    expr_00 = lyxp_parse_expr(expr);
    if (expr_00 != (lyxp_expr *)0x0) {
      uVar8 = 0;
      local_38 = 0;
      do {
        if (expr_00->used <= uVar8) {
          local_40[local_38] = '\0';
          lyxp_expr_free(expr_00);
          pcVar9 = lydict_insert_zc(module->ctx,local_40);
          return pcVar9;
        }
        pcVar9 = expr_00->expr + expr_00->expr_pos[uVar8];
        if ((uVar8 != 0) &&
           (uVar6 = (int)uVar8 - 1,
           pcVar7 = expr_00->expr + (ulong)expr_00->tok_len[uVar6] + (ulong)expr_00->expr_pos[uVar6]
           , pcVar7 != pcVar9)) {
          strncpy(local_40 + local_38,pcVar7,(long)pcVar9 - (long)pcVar7);
          local_38 = local_38 + ((long)pcVar9 - (long)pcVar7);
        }
        uVar6 = (uint)expr_00->tok_len[uVar8];
        if (expr_00->tokens[uVar8] == LYXP_TOKEN_LITERAL) {
          pcVar7 = strnchr(pcVar9,0x3a,uVar6);
          if (pcVar7 == (char *)0x0) goto LAB_0010ef04;
          ppuVar4 = __ctype_b_loc();
          lVar10 = 0;
          while ((((*ppuVar4)[pcVar7[lVar10 + -1]] & 8) != 0 ||
                 ((uVar6 = (byte)pcVar7[lVar10 + -1] - 0x2d, uVar6 < 0x33 &&
                  ((0x4000000000003U >> ((ulong)uVar6 & 0x3f) & 1) != 0))))) {
            lVar10 = lVar10 + -1;
          }
          plVar3 = lys_get_import_module(module,pcVar7 + lVar10,(int)-lVar10,(char *)0x0,0);
          if (plVar3 == (lys_module *)0x0) {
            strncpy(local_40 + local_38,expr_00->expr + expr_00->expr_pos[uVar8],
                    (ulong)expr_00->tok_len[uVar8]);
            local_38 = local_38 + (ulong)expr_00->tok_len[uVar8];
          }
          else {
            sVar2 = strlen(plVar3->name);
            local_58 = local_58 + lVar10 + sVar2;
            local_40 = (char *)ly_realloc(local_40,local_58);
            if (local_40 == (char *)0x0) goto LAB_0010f0e2;
            strncpy(local_40 + local_38,pcVar9,(size_t)(pcVar7 + (lVar10 - (long)pcVar9)));
            strcpy(local_40 + (long)(pcVar7 + lVar10 + (local_38 - (long)pcVar9)),plVar3->name);
            sVar2 = strlen(plVar3->name);
            puVar1 = expr_00->tok_len;
            strncpy(local_40 + (long)(pcVar7 + lVar10 + (local_38 - (long)pcVar9)) + sVar2,pcVar7,
                    (ulong)puVar1[uVar8] - (-lVar10 + (long)(pcVar7 + (lVar10 - (long)pcVar9))));
            local_38 = local_38 + sVar2 + lVar10 + (ulong)puVar1[uVar8];
          }
        }
        else if ((expr_00->tokens[uVar8] == LYXP_TOKEN_NAMETEST) &&
                (pcVar7 = strnchr(pcVar9,0x3a,uVar6), pcVar7 != (char *)0x0)) {
          lVar10 = (long)pcVar7 - (long)pcVar9;
          plVar3 = lys_get_import_module(module,pcVar9,(int)lVar10,(char *)0x0,0);
          if (plVar3 == (lys_module *)0x0) {
            ly_vlog(LYE_INMOD_LEN,LY_VLOG_NONE,(void *)0x0,lVar10,pcVar9);
            break;
          }
          sVar2 = strlen(plVar3->name);
          local_58 = local_58 + (sVar2 - lVar10);
          local_40 = (char *)ly_realloc(local_40,local_58);
          if (local_40 == (char *)0x0) {
LAB_0010f0e2:
            pLVar5 = ly_errno_location();
            *pLVar5 = LY_EMEM;
            local_40 = (char *)0x0;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_schema2json");
            break;
          }
          strcpy(local_40 + local_38,plVar3->name);
          sVar2 = strlen(plVar3->name);
          puVar1 = expr_00->tok_len;
          strncpy(local_40 + sVar2 + local_38,pcVar7,(ulong)puVar1[uVar8] - lVar10);
          local_38 = ((sVar2 + local_38) - lVar10) + (ulong)puVar1[uVar8];
        }
        else {
LAB_0010ef04:
          strncpy(local_40 + local_38,expr_00->expr + expr_00->expr_pos[uVar8],(ulong)uVar6);
          local_38 = local_38 + (ulong)expr_00->tok_len[uVar8];
        }
        uVar8 = uVar8 + 1;
      } while( true );
    }
    free(local_40);
    lyxp_expr_free(expr_00);
  }
  return (char *)0x0;
}

Assistant:

const char *
transform_schema2json(const struct lys_module *module, const char *expr)
{
    const char *end, *cur_expr, *ptr;
    char *out;
    uint16_t i;
    size_t out_size, out_used, pref_len;
    const struct lys_module *mod;
    struct lyxp_expr *exp = NULL;

    out_size = strlen(expr) + 1;
    out = malloc(out_size);
    if (!out) {
        LOGMEM;
        return NULL;
    }
    out_used = 0;

    exp = lyxp_parse_expr(expr);
    if (!exp) {
        goto error;
    }

    for (i = 0; i < exp->used; ++i) {
        cur_expr = &exp->expr[exp->expr_pos[i]];

        /* copy WS */
        if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
            strncpy(&out[out_used], end, cur_expr - end);
            out_used += cur_expr - end;
        }

        if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            /* get the module */
            pref_len = end - cur_expr;
            mod = lys_get_import_module(module, cur_expr, pref_len, NULL, 0);
            if (!mod) {
                LOGVAL(LYE_INMOD_LEN, LY_VLOG_NONE, NULL, pref_len, cur_expr);
                goto error;
            }

            /* adjust out size (it can even decrease in some strange cases) */
            out_size += strlen(mod->name) - pref_len;
            out = ly_realloc(out, out_size);
            if (!out) {
                LOGMEM;
                goto error;
            }

            /* copy the model name */
            strcpy(&out[out_used], mod->name);
            out_used += strlen(mod->name);

            /* copy the rest */
            strncpy(&out[out_used], end, exp->tok_len[i] - pref_len);
            out_used += exp->tok_len[i] - pref_len;
        } else if ((exp->tokens[i] == LYXP_TOKEN_LITERAL) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            ptr = end;
            while (isalnum(ptr[-1]) || (ptr[-1] == '_') || (ptr[-1] == '-') || (ptr[-1] == '.')) {
                --ptr;
            }

            /* get the module */
            pref_len = end - ptr;
            mod = lys_get_import_module(module, ptr, pref_len, NULL, 0);
            if (mod) {
                /* adjust out size (it can even decrease in some strange cases) */
                out_size += strlen(mod->name) - pref_len;
                out = ly_realloc(out, out_size);
                if (!out) {
                    LOGMEM;
                    goto error;
                }

                /* copy any beginning */
                strncpy(&out[out_used], cur_expr, ptr - cur_expr);
                out_used += ptr - cur_expr;

                /* copy the model name */
                strcpy(&out[out_used], mod->name);
                out_used += strlen(mod->name);

                /* copy the rest */
                strncpy(&out[out_used], end, (exp->tok_len[i] - pref_len) - (ptr - cur_expr));
                out_used += (exp->tok_len[i] - pref_len) - (ptr - cur_expr);
            } else {
                strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                out_used += exp->tok_len[i];
            }
        } else {
            strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
            out_used += exp->tok_len[i];
        }
    }
    out[out_used] = '\0';

    lyxp_expr_free(exp);
    return lydict_insert_zc(module->ctx, out);

error:
    free(out);
    lyxp_expr_free(exp);
    return NULL;
}